

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fraClau.c
# Opt level: O3

void Fra_ClauRemapClause(int *pMap,Vec_Int_t *vClause,Vec_Int_t *vRemapped,int fInv)

{
  long lVar1;
  
  vRemapped->nSize = 0;
  if (0 < vClause->nSize) {
    lVar1 = 0;
    do {
      if (pMap[vClause->pArray[lVar1] >> 1] < 0) {
        __assert_fail("pMap[lit_var(iLit)] >= 0",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/proof/fra/fraClau.c"
                      ,0x198,"void Fra_ClauRemapClause(int *, Vec_Int_t *, Vec_Int_t *, int)");
      }
      Vec_IntPush(vRemapped,
                  (uint)((vClause->pArray[lVar1] & 1U) != fInv) +
                  pMap[vClause->pArray[lVar1] >> 1] * 2);
      lVar1 = lVar1 + 1;
    } while (lVar1 < vClause->nSize);
  }
  return;
}

Assistant:

void Fra_ClauRemapClause( int * pMap, Vec_Int_t * vClause, Vec_Int_t * vRemapped, int fInv )
{
    int iLit, i;
    Vec_IntClear( vRemapped );
    Vec_IntForEachEntry( vClause, iLit, i )
    {
        assert( pMap[lit_var(iLit)] >= 0 );
        iLit = toLitCond( pMap[lit_var(iLit)], lit_sign(iLit) ^ fInv );
        Vec_IntPush( vRemapped, iLit );
    }
}